

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O1

string * demo::Tracing::GetContext_abi_cxx11_(void)

{
  string *in_RDI;
  long in_FS_OFFSET;
  Formatter formatter;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  ReverseTrace(*(Tracing **)(in_FS_OFFSET + -0x18),(Formatter *)auStack_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return in_RDI;
}

Assistant:

std::string Tracing::GetContext() {
  Formatter formatter;
  ReverseTrace(GetCurrent(), &formatter);
  return formatter.String();
}